

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Automaton::build(Automaton *this)

{
  long in_FS_OFFSET;
  pair<std::_List_iterator<State>,_bool> pVar1;
  State local_78;
  Item local_28;
  long local_18;
  
  local_78.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_78;
  local_78.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_78;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.rule._M_node = (this->_M_grammar->goal)._M_node;
  local_28.dot._M_node = local_28.rule._M_node[1]._M_prev;
  local_78.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node._M_size = 0;
  local_78.closure.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_78.closure;
  local_78.defaultReduce._M_node = (_List_node_base *)&this->_M_grammar->rules;
  local_78.closure.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node._M_size = 0;
  local_78.bundle.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_*>
          )0x0;
  local_78.reads.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_*>
          )0x0;
  local_78.follows.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_*>
          )0x0;
  local_78.closure.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_78.closure.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
       super__List_node_base._M_next;
  State::insert(&local_78,&local_28);
  pVar1 = internState(this,&local_78);
  (this->start)._M_node = (_List_node_base *)pVar1.first._M_node;
  closure(this,(_List_node_base *)pVar1.first._M_node);
  buildNullables(this);
  buildLookbackSets(this);
  buildReads(this);
  buildIncludesAndFollows(this);
  buildLookaheads(this);
  buildDefaultReduceActions(this);
  State::~State(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::build ()
{
  Item item;
  item.rule = _M_grammar->goal;
  item.dot = _M_grammar->goal->rhs.begin ();

  State tmp (_M_grammar);
  tmp.insert (item);
  start = internState (tmp).first;

  closure (start);

  buildNullables ();
  buildLookbackSets ();
  buildReads ();
  buildIncludesAndFollows ();
  buildLookaheads ();
  buildDefaultReduceActions ();
}